

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void sptk::world::InitializeMinimumPhaseAnalysis(int fft_size,MinimumPhaseAnalysis *minimum_phase)

{
  ulong uVar1;
  int iVar2;
  double *in;
  fft_complex *padVar3;
  long lVar4;
  long lVar5;
  fft_plan *pfVar6;
  fft_plan *pfVar7;
  ulong uVar8;
  byte bVar9;
  fft_plan local_70;
  
  bVar9 = 0;
  minimum_phase->fft_size = fft_size;
  uVar8 = (long)fft_size << 4;
  uVar1 = (long)fft_size * 8;
  if (fft_size < 0) {
    uVar8 = 0xffffffffffffffff;
    uVar1 = 0xffffffffffffffff;
  }
  in = (double *)operator_new__(uVar1);
  minimum_phase->log_spectrum = in;
  padVar3 = (fft_complex *)operator_new__(uVar8);
  minimum_phase->minimum_phase_spectrum = padVar3;
  padVar3 = (fft_complex *)operator_new__(uVar8);
  minimum_phase->cepstrum = padVar3;
  fft_plan_dft_r2c_1d(&local_70,fft_size,in,padVar3,3);
  lVar5 = 9;
  pfVar6 = &local_70;
  pfVar7 = &minimum_phase->inverse_fft;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    iVar2 = pfVar6->sign;
    pfVar7->n = pfVar6->n;
    pfVar7->sign = iVar2;
    pfVar6 = (fft_plan *)((long)pfVar6 + (ulong)bVar9 * -0x10 + 8);
    pfVar7 = (fft_plan *)((long)pfVar7 + (ulong)bVar9 * -0x10 + 8);
  }
  fft_plan_dft_1d(&local_70,fft_size,minimum_phase->cepstrum,minimum_phase->minimum_phase_spectrum,1
                  ,3);
  pfVar6 = &local_70;
  pfVar7 = &minimum_phase->forward_fft;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    iVar2 = pfVar6->sign;
    pfVar7->n = pfVar6->n;
    pfVar7->sign = iVar2;
    pfVar6 = (fft_plan *)((long)pfVar6 + (ulong)bVar9 * -0x10 + 8);
    pfVar7 = (fft_plan *)((long)pfVar7 + (ulong)bVar9 * -0x10 + 8);
  }
  return;
}

Assistant:

void InitializeMinimumPhaseAnalysis(int fft_size,
    MinimumPhaseAnalysis *minimum_phase) {
  minimum_phase->fft_size = fft_size;
  minimum_phase->log_spectrum = new double[fft_size];
  minimum_phase->minimum_phase_spectrum = new fft_complex[fft_size];
  minimum_phase->cepstrum = new fft_complex[fft_size];
  minimum_phase->inverse_fft = fft_plan_dft_r2c_1d(fft_size,
      minimum_phase->log_spectrum, minimum_phase->cepstrum, FFT_ESTIMATE);
  minimum_phase->forward_fft = fft_plan_dft_1d(fft_size,
      minimum_phase->cepstrum, minimum_phase->minimum_phase_spectrum,
      FFT_FORWARD, FFT_ESTIMATE);
}